

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::InverseNodeSearch
          (Discreet3DSImporter *this,Node *pcNode,Node *pcCurrent)

{
  Node *pcCurrent_local;
  Node *pcNode_local;
  Discreet3DSImporter *this_local;
  
  if (pcCurrent == (Node *)0x0) {
    D3DS::Node::push_back(this->mRootNode,pcNode);
  }
  else if (pcCurrent->mHierarchyPos == pcNode->mHierarchyPos) {
    if (pcCurrent->mParent == (Node *)0x0) {
      D3DS::Node::push_back(pcCurrent,pcNode);
    }
    else {
      D3DS::Node::push_back(pcCurrent->mParent,pcNode);
    }
  }
  else {
    InverseNodeSearch(this,pcNode,pcCurrent->mParent);
  }
  return;
}

Assistant:

void Discreet3DSImporter::InverseNodeSearch(D3DS::Node* pcNode,D3DS::Node* pcCurrent)
{
    if (!pcCurrent) {
        mRootNode->push_back(pcNode);
        return;
    }

    if (pcCurrent->mHierarchyPos == pcNode->mHierarchyPos)  {
        if(pcCurrent->mParent) {
            pcCurrent->mParent->push_back(pcNode);
        }
        else pcCurrent->push_back(pcNode);
        return;
    }
    return InverseNodeSearch(pcNode,pcCurrent->mParent);
}